

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pnm.hpp
# Opt level: O0

rgb __thiscall baryonyx::colormap::operator()(colormap *this,longdouble v_)

{
  float fVar1;
  undefined1 auVar2 [16];
  rgb local_40;
  float local_3c;
  float local_38;
  float b;
  float g;
  float r;
  float dv;
  float v;
  longdouble v__local;
  colormap *this_local;
  
  r = (float)v_;
  if (r < this->m_lower) {
    r = this->m_lower;
  }
  if (this->m_upper < r) {
    r = this->m_upper;
  }
  fVar1 = this->m_upper - this->m_lower;
  b = 1.0;
  local_38 = 1.0;
  local_3c = 1.0;
  auVar2 = vfmadd213ss_fma(SUB6416(ZEXT464(0x3e800000),0),ZEXT416((uint)fVar1),
                           ZEXT416((uint)this->m_lower));
  if (auVar2._0_4_ <= r) {
    auVar2 = vfmadd213ss_fma(SUB6416(ZEXT464(0x3f000000),0),ZEXT416((uint)fVar1),
                             ZEXT416((uint)this->m_lower));
    if (auVar2._0_4_ <= r) {
      auVar2 = vfmadd213ss_fma(SUB6416(ZEXT464(0x3f400000),0),ZEXT416((uint)fVar1),
                               ZEXT416((uint)this->m_lower));
      if (auVar2._0_4_ <= r) {
        auVar2 = vfmadd213ss_fma(SUB6416(ZEXT464(0x3f400000),0),ZEXT416((uint)fVar1),
                                 ZEXT416((uint)this->m_lower));
        local_38 = ((auVar2._0_4_ - r) * 4.0) / fVar1 + 1.0;
      }
      else {
        auVar2 = vfmadd213ss_fma(SUB6416(ZEXT464(0xbf000000),0),ZEXT416((uint)fVar1),
                                 ZEXT416((uint)(r - this->m_lower)));
        b = (auVar2._0_4_ * 4.0) / fVar1;
      }
      local_3c = 0.0;
    }
    else {
      b = 0.0;
      auVar2 = vfmadd213ss_fma(SUB6416(ZEXT464(0x3e800000),0),ZEXT416((uint)fVar1),
                               ZEXT416((uint)this->m_lower));
      local_3c = ((auVar2._0_4_ - r) * 4.0) / fVar1 + 1.0;
    }
  }
  else {
    b = 0.0;
    local_38 = ((r - this->m_lower) * 4.0) / fVar1;
  }
  rgb::rgb((rgb *)((long)&this_local + 5),(uint8_t)(int)(b * 255.0),(uint8_t)(int)(local_38 * 255.0)
           ,(uint8_t)(int)(local_3c * 255.0));
  local_40.blue = this_local._7_1_;
  local_40.red = this_local._5_1_;
  local_40.green = this_local._6_1_;
  return local_40;
}

Assistant:

rgb operator()(T v_) noexcept
    {
        float v = static_cast<float>(v_);

        if (v < m_lower)
            v = m_lower;

        if (v > m_upper)
            v = m_upper;

        float dv = m_upper - m_lower;
        float r = 1.f, g = 1.f, b = 1.f;

        if (v < (m_lower + 0.25f * dv)) {
            r = 0.f;
            g = 4.f * (v - m_lower) / dv;
        } else if (v < (m_lower + 0.5f * dv)) {
            r = 0.f;
            b = 1.f + 4.f * (m_lower + 0.25f * dv - v) / dv;
        } else if (v < (m_lower + 0.75f * dv)) {
            r = 4.f * (v - m_lower - 0.5f * dv) / dv;
            b = 0.f;
        } else {
            g = 1.f + 4.f * (m_lower + 0.75f * dv - v) / dv;
            b = 0.f;
        }

        return rgb(static_cast<std::uint8_t>(r * 255.f),
                   static_cast<std::uint8_t>(g * 255.f),
                   static_cast<std::uint8_t>(b * 255.f));
    }